

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_qnames(lysp_yang_ctx *ctx,ly_stmt parent_stmt,lysp_qname **qnames,yang_arg arg,
                   lysp_ext_instance **exts)

{
  uint16_t *flags;
  lysp_qname *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 in_register_0000000c;
  ly_ctx *plVar7;
  uint64_t parent_stmt_index;
  lysp_yang_ctx *ctx_00;
  bool bVar8;
  ly_stmt kw;
  lysp_yang_ctx *local_58;
  char *word;
  size_t word_len;
  lysp_ext_instance **local_40;
  char *buf;
  
  plVar1 = *qnames;
  if (plVar1 == (lysp_qname *)0x0) {
    plVar3 = (long *)malloc(0x20);
    if (plVar3 == (long *)0x0) goto LAB_0016cc5c;
    *plVar3 = 1;
    lVar4 = 1;
  }
  else {
    lVar4 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar4 + 1;
    plVar3 = (long *)realloc(&plVar1[-1].flags,lVar4 * 0x18 + 0x20);
    if (plVar3 == (long *)0x0) {
      *(long *)&(*qnames)[-1].flags = *(long *)&(*qnames)[-1].flags + -1;
LAB_0016cc5c:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_qnames");
      return LY_EMEM;
    }
    lVar4 = *plVar3;
  }
  *qnames = (lysp_qname *)(plVar3 + 1);
  flags = (uint16_t *)(plVar3 + lVar4 * 3);
  flags[-8] = 0;
  flags[-7] = 0;
  flags[-6] = 0;
  flags[-5] = 0;
  flags[-4] = 0;
  flags[-3] = 0;
  flags[-2] = 0;
  flags[-1] = 0;
  flags[0] = 0;
  flags[1] = 0;
  flags[2] = 0;
  flags[3] = 0;
  local_40 = (lysp_ext_instance **)CONCAT44(in_register_0000000c,arg);
  LVar2 = get_argument(ctx,Y_STR_ARG,flags,&word,&buf,&word_len);
  if (LVar2 == LY_SUCCESS) {
    local_58 = ctx;
    if (buf == (char *)0x0) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar5 = word;
      if (word_len == 0) {
        pcVar5 = "";
      }
      LVar2 = lydict_insert(plVar7,pcVar5,word_len,(char **)(plVar3 + lVar4 * 3 + -2));
    }
    else {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar7 = (ly_ctx *)0x0;
      }
      else {
        plVar7 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar2 = lydict_insert_zc(plVar7,word,(char **)(plVar3 + lVar4 * 3 + -2));
    }
    if (LVar2 == LY_SUCCESS) {
      *(lyd_node **)(flags + -4) =
           (local_58->parsed_mods->field_2).dnodes[local_58->parsed_mods->count - 1];
      LVar2 = get_keyword(local_58,&kw,&word,&word_len);
      ctx_00 = local_58;
      if (LVar2 == LY_SUCCESS) {
        if (kw == LY_STMT_SYNTAX_SEMICOLON) {
          bVar8 = true;
        }
        else {
          if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
            plVar7 = (ly_ctx *)
                     **(undefined8 **)
                       (local_58->parsed_mods->field_2).dnodes[local_58->parsed_mods->count - 1];
            pcVar5 = lyplg_ext_stmt2str(kw);
            ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar5);
            return LY_EVALID;
          }
          LVar2 = get_keyword(local_58,&kw,&word,&word_len);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          bVar8 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        while (!bVar8) {
          if (kw != LY_STMT_EXTENSION_INSTANCE) {
            if (ctx_00 == (lysp_yang_ctx *)0x0) {
              plVar7 = (ly_ctx *)0x0;
            }
            else {
              plVar7 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx_00->parsed_mods->field_2).dnodes[ctx_00->parsed_mods->count - 1];
            }
            pcVar5 = lyplg_ext_stmt2str(kw);
            pcVar6 = lyplg_ext_stmt2str(parent_stmt);
            ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\" as a child of \"%s\".",pcVar5,pcVar6);
            return LY_EVALID;
          }
          plVar1 = *qnames;
          parent_stmt_index = 0xffffffffffffffff;
          if (plVar1 != (lysp_qname *)0x0) {
            parent_stmt_index = *(long *)&plVar1[-1].flags - 1;
          }
          LVar2 = parse_ext(ctx_00,word,word_len,plVar1,parent_stmt,parent_stmt_index,local_40);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          LVar2 = get_keyword(ctx_00,&kw,&word,&word_len);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          ctx_00 = local_58;
          bVar8 = kw == LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        LVar2 = LY_SUCCESS;
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
parse_qnames(struct lysp_yang_ctx *ctx, enum ly_stmt parent_stmt, struct lysp_qname **qnames, enum yang_arg arg,
        struct lysp_ext_instance **exts)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    struct lysp_qname *item;
    size_t word_len;
    enum ly_stmt kw;

    /* allocate new pointer */
    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *qnames, item, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, arg, &item->flags, &word, &buf, &word_len));

    INSERT_WORD_GOTO(ctx, buf, item->str, word, word_len, ret, cleanup);
    item->mod = PARSER_CUR_PMOD(ctx);
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, *qnames, parent_stmt, LY_ARRAY_COUNT(*qnames) - 1, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(parent_stmt));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}